

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_status_code.hpp
# Opt level: O0

bool __thiscall
system_error2::detail::
indirecting_domain<system_error2::status_code<system_error2::_posix_code_domain>,_std::allocator<system_error2::status_code<system_error2::_posix_code_domain>_>_>
::_do_equivalent(indirecting_domain<system_error2::status_code<system_error2::_posix_code_domain>,_std::allocator<system_error2::status_code<system_error2::_posix_code_domain>_>_>
                 *this,status_code<void> *code1,status_code<void> *code2)

{
  bool bVar1;
  status_code_domain *this_00;
  value_type *pppVar2;
  _posix_code_domain local_38;
  status_code_storage<system_error2::detail::indirecting_domain<system_error2::status_code<system_error2::_posix_code_domain>,_std::allocator<system_error2::status_code<system_error2::_posix_code_domain>_>_>_>
  *local_28;
  _mycode *c1;
  status_code<void> *code2_local;
  status_code<void> *code1_local;
  indirecting_domain<system_error2::status_code<system_error2::_posix_code_domain>,_std::allocator<system_error2::status_code<system_error2::_posix_code_domain>_>_>
  *this_local;
  
  c1 = (_mycode *)code2;
  code2_local = code1;
  code1_local = (status_code<void> *)this;
  this_00 = status_code<void>::domain(code1);
  bVar1 = status_code_domain::operator==(this_00,&this->super_status_code_domain);
  if (!bVar1) {
    __assert_fail("code1.domain() == *this",
                  "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/nested_status_code.hpp"
                  ,0x67,
                  "virtual bool system_error2::detail::indirecting_domain<system_error2::status_code<system_error2::_posix_code_domain>, std::allocator<system_error2::status_code<system_error2::_posix_code_domain>>>::_do_equivalent(const status_code<void> &, const status_code<void> &) const [StatusCode = system_error2::status_code<system_error2::_posix_code_domain>, Allocator = std::allocator<system_error2::status_code<system_error2::_posix_code_domain>>]"
                 );
  }
  local_28 = (status_code_storage<system_error2::detail::indirecting_domain<system_error2::status_code<system_error2::_posix_code_domain>,_std::allocator<system_error2::status_code<system_error2::_posix_code_domain>_>_>_>
              *)code2_local;
  _posix_code_domain::_posix_code_domain(&local_38,0xa59a56fe5f310933);
  pppVar2 = status_code_storage<system_error2::detail::indirecting_domain<system_error2::status_code<system_error2::_posix_code_domain>,_std::allocator<system_error2::status_code<system_error2::_posix_code_domain>_>_>_>
            ::value(local_28);
  bVar1 = _posix_code_domain::_do_equivalent
                    (&local_38,(status_code<void> *)*pppVar2,(status_code<void> *)c1);
  return bVar1;
}

Assistant:

virtual bool _do_equivalent(const status_code<void> &code1, const status_code<void> &code2) const noexcept override  // NOLINT
    {
      assert(code1.domain() == *this);
      const auto &c1 = static_cast<const _mycode &>(code1);  // NOLINT
      return static_cast<status_code_domain &&>(typename StatusCode::domain_type())._do_equivalent(c1.value()->sc, code2);
    }